

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O1

void __thiscall
cnn::Node::forward(Node *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
                  Tensor *fx)

{
  Tensor *pTVar1;
  int iVar2;
  pointer ppTVar3;
  ulong uVar4;
  long lVar5;
  uint b;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs_ptrs;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> xs_elems;
  Tensor fx_elem;
  void *local_c8;
  iterator iStack_c0;
  Tensor **local_b8;
  Node *local_a8;
  Tensor *local_a0;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_98;
  Tensor *local_78 [6];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  
  local_a8 = this;
  iVar2 = (*this->_vptr_Node[7])();
  if (((char)iVar2 == '\0') && ((fx->d).bd != 1)) {
    if ((fx->d).bd != 0) {
      b = 0;
      local_a0 = fx;
      do {
        local_98.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8 = (Tensor **)0x0;
        local_c8 = (void *)0x0;
        iStack_c0._M_current = (Tensor **)0x0;
        ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish != ppTVar3) {
          uVar4 = 0;
          do {
            Tensor::batch_elem((Tensor *)local_78,ppTVar3[uVar4],b);
            std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::emplace_back<cnn::Tensor>
                      (&local_98,(Tensor *)local_78);
            std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
            uVar4 = uVar4 + 1;
            ppTVar3 = (xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar4 < (ulong)((long)(xs->
                                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3
                                  >> 3));
        }
        if ((xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish !=
            (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start) {
          lVar5 = 0;
          uVar4 = 0;
          do {
            local_78[0] = (Tensor *)
                          ((long)((local_98.
                                   super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->d).d + lVar5);
            if (iStack_c0._M_current == local_b8) {
              std::vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>>::
              _M_realloc_insert<cnn::Tensor_const*>
                        ((vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>> *)&local_c8,
                         iStack_c0,local_78);
            }
            else {
              *iStack_c0._M_current = local_78[0];
              iStack_c0._M_current = iStack_c0._M_current + 1;
            }
            uVar4 = uVar4 + 1;
            lVar5 = lVar5 + 0x48;
          } while (uVar4 < (ulong)((long)(xs->
                                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(xs->
                                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        pTVar1 = local_a0;
        Tensor::batch_elem((Tensor *)local_78,local_a0,b);
        (*local_a8->_vptr_Node[5])(local_a8,&local_c8,(Tensor *)local_78);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
        if (local_c8 != (void *)0x0) {
          operator_delete(local_c8);
        }
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_98);
        b = b + 1;
      } while (b < (pTVar1->d).bd);
    }
    return;
  }
  (*local_a8->_vptr_Node[5])(local_a8,xs,fx);
  return;
}

Assistant:

void Node::forward(const std::vector<const Tensor*>& xs,
                   Tensor& fx) const {
  if(this->supports_multibatch() || fx.d.batch_elems() == 1) {
    forward_impl(xs, fx);
  } else {
    for(unsigned b = 0; b < fx.d.batch_elems(); ++b) {
      std::vector<Tensor>  xs_elems;
      std::vector<const Tensor*> xs_ptrs;
      for(size_t i = 0; i < xs.size(); ++i) xs_elems.push_back(xs[i]->batch_elem(b));
      for(size_t i = 0; i < xs.size(); ++i) xs_ptrs.push_back(&xs_elems[i]);
      Tensor fx_elem(fx.batch_elem(b));
      forward_impl(xs_ptrs, fx_elem);
    }
  }
}